

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>,write_face_v4>
          (xr_writer *this,undefined8 *container)

{
  cf_face *pcVar1;
  cf_face *face;
  write_face_v4 local_21;
  
  pcVar1 = (cf_face *)container[1];
  for (face = (cf_face *)*container; face != pcVar1; face = face + 1) {
    write_face_v4::operator()(&local_21,face,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}